

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_lsd_adaptive<10u>(Cacheblock<10U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *__src;
  long lVar4;
  Cacheblock<10U> *pCVar5;
  size_t sVar6;
  ushort uVar7;
  uchar *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  Cacheblock<10U> *pCStack_80050;
  size_t sStack_80048;
  long alStack_80038 [65537];
  
  pCStack_80050 = cache;
  sStack_80048 = depth;
LAB_001e3746:
  if (N < 0x10000) {
    msd_lsd<10u>(pCStack_80050,N,sStack_80048);
    return;
  }
  fill_cache<10u>(pCStack_80050,N,sStack_80048);
  uVar9 = 8;
  for (iVar12 = 9; 0 < iVar12; iVar12 = iVar12 + -2) {
    puVar8 = (pCStack_80050->chars)._M_elems + uVar9 + 1;
    memset(alStack_80038,0,0x80000);
    uVar3 = N;
    while (bVar13 = uVar3 != 0, uVar3 = uVar3 - 1, bVar13) {
      alStack_80038[(ushort)(*(ushort *)(puVar8 + -1) << 8 | *(ushort *)(puVar8 + -1) >> 8)] =
           alStack_80038[(ushort)(*(ushort *)(puVar8 + -1) << 8 | *(ushort *)(puVar8 + -1) >> 8)] +
           1;
      puVar8 = puVar8 + 0x18;
    }
    __src = malloc(N * 0x18);
    msd_lsd_adaptive<10U>::bucketindex[0] = 0;
    sVar6 = 0;
    for (lVar4 = 0; pCVar5 = pCStack_80050, uVar3 = N, lVar4 != 0xffff; lVar4 = lVar4 + 1) {
      sVar6 = sVar6 + alStack_80038[lVar4];
      msd_lsd_adaptive<10U>::bucketindex[lVar4 + 1] = sVar6;
    }
    while (uVar3 != 0) {
      uVar7 = *(ushort *)((pCVar5->chars)._M_elems + uVar9);
      uVar7 = uVar7 << 8 | uVar7 >> 8;
      sVar6 = msd_lsd_adaptive<10U>::bucketindex[uVar7];
      msd_lsd_adaptive<10U>::bucketindex[uVar7] = sVar6 + 1;
      lVar4 = sVar6 * 0x18;
      *(uchar **)((long)__src + lVar4 + 0x10) = pCVar5->ptr;
      uVar2 = *(undefined8 *)((pCVar5->chars)._M_elems + 8);
      puVar1 = (undefined8 *)((long)__src + lVar4);
      *puVar1 = *(undefined8 *)(pCVar5->chars)._M_elems;
      puVar1[1] = uVar2;
      pCVar5 = pCVar5 + 1;
      uVar3 = uVar3 - 1;
    }
    memcpy(pCStack_80050,__src,N * 0x18);
    free(__src);
    uVar9 = (ulong)((int)uVar9 - 2);
  }
  sStack_80048 = sStack_80048 + 10;
  lVar4 = 0;
  do {
    lVar10 = lVar4;
    lVar11 = -1;
    pCVar5 = pCStack_80050 + lVar10;
    while( true ) {
      if (lVar10 - N == lVar11) {
        N = -lVar11;
        if ((N == 0 || lVar11 == -1) ||
           (pCVar5 = pCStack_80050 + lVar10, pCStack_80050 = pCStack_80050 + lVar10,
           (pCVar5->chars)._M_elems[9] == '\0')) {
          return;
        }
        goto LAB_001e3746;
      }
      iVar12 = bcmp(pCVar5,pCVar5 + 1,10);
      if (iVar12 != 0) break;
      lVar11 = lVar11 + -1;
      pCVar5 = pCVar5 + 1;
    }
    lVar4 = lVar10 - lVar11;
    if ((1 < (ulong)-lVar11) && (pCStack_80050[lVar10].chars._M_elems[9] != '\0')) {
      msd_lsd_adaptive<10u>(pCStack_80050 + lVar10,-lVar11,sStack_80048);
    }
  } while( true );
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}